

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

bool nite::isNumber(string *number)

{
  _Alloc_hider _Var1;
  int iVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  string local_78;
  string local_58;
  ulong local_38;
  
  if ((isNumber(std::__cxx11::string)::numbers_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&isNumber(std::__cxx11::string)::numbers_abi_cxx11_), iVar2 != 0))
  {
    isNumber(std::__cxx11::string)::numbers_abi_cxx11_[0]._M_dataplus._M_p =
         (pointer)&isNumber(std::__cxx11::string)::numbers_abi_cxx11_[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)isNumber(std::__cxx11::string)::numbers_abi_cxx11_,"0","");
    isNumber(std::__cxx11::string)::numbers_abi_cxx11_[1]._M_dataplus._M_p =
         (pointer)&isNumber(std::__cxx11::string)::numbers_abi_cxx11_[1].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(isNumber(std::__cxx11::string)::numbers_abi_cxx11_ + 1),"1","");
    isNumber(std::__cxx11::string)::numbers_abi_cxx11_[2]._M_dataplus._M_p =
         (pointer)&isNumber(std::__cxx11::string)::numbers_abi_cxx11_[2].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(isNumber(std::__cxx11::string)::numbers_abi_cxx11_ + 2),"2","");
    isNumber(std::__cxx11::string)::numbers_abi_cxx11_[3]._M_dataplus._M_p =
         (pointer)&isNumber(std::__cxx11::string)::numbers_abi_cxx11_[3].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(isNumber(std::__cxx11::string)::numbers_abi_cxx11_ + 3),"3","");
    isNumber(std::__cxx11::string)::numbers_abi_cxx11_[4]._M_dataplus._M_p =
         (pointer)&isNumber(std::__cxx11::string)::numbers_abi_cxx11_[4].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(isNumber(std::__cxx11::string)::numbers_abi_cxx11_ + 4),"4","");
    isNumber(std::__cxx11::string)::numbers_abi_cxx11_[5]._M_dataplus._M_p =
         (pointer)&isNumber(std::__cxx11::string)::numbers_abi_cxx11_[5].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(isNumber(std::__cxx11::string)::numbers_abi_cxx11_ + 5),"5","");
    isNumber(std::__cxx11::string)::numbers_abi_cxx11_[6]._M_dataplus._M_p =
         (pointer)&isNumber(std::__cxx11::string)::numbers_abi_cxx11_[6].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(isNumber(std::__cxx11::string)::numbers_abi_cxx11_ + 6),"6","");
    isNumber(std::__cxx11::string)::numbers_abi_cxx11_[7]._M_dataplus._M_p =
         (pointer)&isNumber(std::__cxx11::string)::numbers_abi_cxx11_[7].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(isNumber(std::__cxx11::string)::numbers_abi_cxx11_ + 7),"7","");
    isNumber(std::__cxx11::string)::numbers_abi_cxx11_[8]._M_dataplus._M_p =
         (pointer)&isNumber(std::__cxx11::string)::numbers_abi_cxx11_[8].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(isNumber(std::__cxx11::string)::numbers_abi_cxx11_ + 8),"8","");
    isNumber(std::__cxx11::string)::numbers_abi_cxx11_[9]._M_dataplus._M_p =
         (pointer)&isNumber(std::__cxx11::string)::numbers_abi_cxx11_[9].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(isNumber(std::__cxx11::string)::numbers_abi_cxx11_ + 9),"9","");
    isNumber(std::__cxx11::string)::numbers_abi_cxx11_[10]._M_dataplus._M_p =
         (pointer)&isNumber(std::__cxx11::string)::numbers_abi_cxx11_[10].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(isNumber(std::__cxx11::string)::numbers_abi_cxx11_ + 10),".","");
    __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
    __cxa_guard_release(&isNumber(std::__cxx11::string)::numbers_abi_cxx11_);
  }
  strAt(&local_58,number,0);
  iVar2 = std::__cxx11::string::compare((char *)&local_58);
  if (iVar2 == 0) {
    bVar4 = true;
  }
  else {
    strAt(&local_78,number,0);
    iVar2 = std::__cxx11::string::compare((char *)&local_78);
    bVar4 = iVar2 == 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if (bVar4) {
    std::__cxx11::string::erase((ulong)number,0);
  }
  local_38 = 0;
  if (number->_M_string_length == 0) {
    bVar4 = false;
  }
  else {
    do {
      lVar3 = 8;
      bVar4 = false;
      do {
        strAt(&local_58,number,(uint)local_38);
        _Var1._M_p = local_58._M_dataplus._M_p;
        if (local_58._M_string_length ==
            *(size_t *)
             ((long)&isNumber(std::__cxx11::string)::numbers_abi_cxx11_[0]._M_dataplus._M_p + lVar3)
           ) {
          if (local_58._M_string_length == 0) {
            bVar5 = true;
          }
          else {
            iVar2 = bcmp(local_58._M_dataplus._M_p,*(void **)(DKGray + lVar3 + 8),
                         local_58._M_string_length);
            bVar5 = iVar2 == 0;
          }
        }
        else {
          bVar5 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var1._M_p != &local_58.field_2) {
          operator_delete(_Var1._M_p);
        }
        if (bVar5) {
          bVar4 = true;
        }
        lVar3 = lVar3 + 0x20;
      } while (lVar3 != 0x168);
    } while ((bVar4) && (local_38 = (ulong)((int)local_38 + 1), local_38 < number->_M_string_length)
            );
  }
  return bVar4;
}

Assistant:

bool nite::isNumber(String number){
	static const String numbers[]={
		"0","1","2","3","4","5",
		"6","7","8","9","."
	};
	static const unsigned size = sizeof(numbers)/sizeof(String);

	/* remove signs */
	if (nite::strAt(number,0)=="+" or nite::strAt(number,0)=="-")
		number.erase(0,1);

	if (number.length()==0)
		return 0;
	bool n=0;
	for (unsigned i=0; i<number.length(); i++){
		n=0;
		for (unsigned e=0; e<size; e++){
			if (nite::strAt(number,i)==numbers[e])
				n=1;
		}
		if (n==0)
			return 0;
	}
    return 1;

}